

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  stbtt__point *pts;
  float local_5c;
  stbtt__point *windings;
  int *winding_lengths;
  int winding_count;
  float scale;
  int invert_local;
  int y_off_local;
  int x_off_local;
  float shift_y_local;
  float shift_x_local;
  float scale_y_local;
  float scale_x_local;
  int num_verts_local;
  stbtt_vertex *vertices_local;
  stbtt__bitmap *psStack_10;
  float flatness_in_pixels_local;
  stbtt__bitmap *result_local;
  
  local_5c = scale_x;
  if (scale_y < scale_x) {
    local_5c = scale_y;
  }
  winding_lengths._4_4_ = local_5c;
  winding_lengths._0_4_ = 0;
  windings = (stbtt__point *)0x0;
  winding_count = invert;
  scale = (float)y_off;
  invert_local = x_off;
  y_off_local = (int)shift_y;
  x_off_local = (int)shift_x;
  shift_y_local = scale_y;
  shift_x_local = scale_x;
  scale_y_local = (float)num_verts;
  _scale_x_local = vertices;
  vertices_local._4_4_ = flatness_in_pixels;
  psStack_10 = result;
  pts = stbtt_FlattenCurves(vertices,num_verts,flatness_in_pixels / local_5c,(int **)&windings,
                            (int *)&winding_lengths,userdata);
  if (pts != (stbtt__point *)0x0) {
    stbtt__rasterize(psStack_10,pts,(int *)windings,(int)winding_lengths,shift_x_local,shift_y_local
                     ,(float)x_off_local,(float)y_off_local,invert_local,(int)scale,winding_count,
                     userdata);
    free(windings);
    free(pts);
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale            = scale_x > scale_y ? scale_y : scale_x;
   int winding_count      = 0;
   int *winding_lengths   = NULL;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}